

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kratos_expr.hh
# Opt level: O1

void def_attributes<pybind11::class_<kratos::Var,std::shared_ptr<kratos::Var>>,kratos::Var>
               (class_<kratos::Var,_std::shared_ptr<kratos::Var>_> *class_)

{
  class_<kratos::Var,std::shared_ptr<kratos::Var>> *pcVar1;
  code *local_68;
  undefined8 local_60;
  code *local_58;
  undefined8 local_50;
  code *local_48;
  undefined8 local_40;
  code *local_38;
  undefined8 local_30;
  type local_24;
  return_value_policy local_23 [2];
  type local_21;
  
  local_68 = kratos::IRNode::add_attribute;
  local_60 = 0;
  pcVar1 = (class_<kratos::Var,std::shared_ptr<kratos::Var>> *)
           pybind11::class_<kratos::Var,std::shared_ptr<kratos::Var>>::
           def<void(kratos::IRNode::*)(std::shared_ptr<kratos::Attribute>const&)>
                     ((class_<kratos::Var,std::shared_ptr<kratos::Var>> *)class_,"add_attribute",
                      (offset_in_IRNode_to_subr *)&local_68);
  pcVar1 = (class_<kratos::Var,std::shared_ptr<kratos::Var>> *)
           pybind11::class_<kratos::Var,std::shared_ptr<kratos::Var>>::
           def<def_attributes<pybind11::class_<kratos::Var,std::shared_ptr<kratos::Var>>,kratos::Var>(pybind11::class_<kratos::Var,std::shared_ptr<kratos::Var>>&)::_lambda(kratos::Var&,std::__cxx11::string_const&)_1_>
                     (pcVar1,"add_attribute",&local_24);
  local_58 = kratos::IRNode::get_attributes;
  local_50 = 0;
  local_23[0] = reference;
  pcVar1 = (class_<kratos::Var,std::shared_ptr<kratos::Var>> *)
           pybind11::class_<kratos::Var,std::shared_ptr<kratos::Var>>::
           def<std::vector<std::shared_ptr<kratos::Attribute>,std::allocator<std::shared_ptr<kratos::Attribute>>>const&(kratos::IRNode::*)()const,pybind11::return_value_policy>
                     (pcVar1,"get_attributes",(offset_in_IRNode_to_subr *)&local_58,local_23);
  local_48 = kratos::IRNode::has_attribute;
  local_40 = 0;
  pcVar1 = (class_<kratos::Var,std::shared_ptr<kratos::Var>> *)
           pybind11::class_<kratos::Var,std::shared_ptr<kratos::Var>>::
           def<bool(kratos::IRNode::*)(std::__cxx11::string_const&)const>
                     (pcVar1,"has_attribute",(offset_in_IRNode_to_subr *)&local_48);
  local_38 = kratos::IRNode::get_attributes;
  local_30 = 0;
  local_23[1] = 5;
  pcVar1 = (class_<kratos::Var,std::shared_ptr<kratos::Var>> *)
           pybind11::class_<kratos::Var,std::shared_ptr<kratos::Var>>::
           def_property_readonly<std::vector<std::shared_ptr<kratos::Attribute>,std::allocator<std::shared_ptr<kratos::Attribute>>>const&(kratos::IRNode::*)()const,pybind11::return_value_policy>
                     (pcVar1,"attributes",(offset_in_IRNode_to_subr *)&local_38,local_23 + 1);
  pybind11::class_<kratos::Var,std::shared_ptr<kratos::Var>>::
  def<def_attributes<pybind11::class_<kratos::Var,std::shared_ptr<kratos::Var>>,kratos::Var>(pybind11::class_<kratos::Var,std::shared_ptr<kratos::Var>>&)::_lambda(kratos::Var&,std::function<bool(std::shared_ptr<kratos::Attribute>)>const&)_1_>
            (pcVar1,"find_attribute",&local_21);
  return;
}

Assistant:

void def_attributes(T &class_) {
    namespace py = pybind11;
    class_.def("add_attribute", &K::add_attribute)
        .def("add_attribute",
             [](K &obj, const std::string &value) {
                 auto attr = std::make_shared<kratos::Attribute>();
                 attr->type_str = "Python";
                 attr->value_str = value;
                 obj.add_attribute(attr);
             })
        .def("get_attributes", &K::get_attributes, py::return_value_policy::reference)
        .def("has_attribute", &K::has_attribute)
        .def_property_readonly("attributes", &K::get_attributes, py::return_value_policy::reference)
        .def("find_attribute",
             [](K &node, const std::function<bool(std::shared_ptr<kratos::Attribute>)> &func) {
                 auto const &attributes = node.get_attributes();
                 std::vector<std::shared_ptr<kratos::Attribute>> result;
                 for (auto const &attr : attributes) {
                     if (func(attr)) result.emplace_back(attr);
                 }
                 return result;
             });
}